

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

void __thiscall CommandDrawString::ParseStringValue(CommandDrawString *this,FScanner *sc)

{
  bool bVar1;
  char *copyStr;
  uint uVar2;
  
  bVar1 = FScanner::CheckToken(sc,0x101);
  if (!bVar1) {
    this->strValue = CONSTANT;
    FScanner::MustGetToken(sc,0x102);
    copyStr = sc->String;
    if (*copyStr == '$') {
      copyStr = FStringTable::operator[](&GStrings,copyStr + 1);
    }
    FString::operator=(&this->str,copyStr);
    return;
  }
  bVar1 = FScanner::Compare(sc,"levelname");
  if (bVar1) {
    this->strValue = LEVELNAME;
  }
  else {
    bVar1 = FScanner::Compare(sc,"levellump");
    if (bVar1) {
      this->strValue = LEVELLUMP;
    }
    else {
      bVar1 = FScanner::Compare(sc,"skillname");
      if (bVar1) {
        this->strValue = SKILLNAME;
      }
      else {
        bVar1 = FScanner::Compare(sc,"playerclass");
        if (bVar1) {
          this->strValue = PLAYERCLASS;
        }
        else {
          bVar1 = FScanner::Compare(sc,"playername");
          if (bVar1) {
            this->strValue = PLAYERNAME;
          }
          else {
            bVar1 = FScanner::Compare(sc,"ammo1tag");
            if (bVar1) {
              this->strValue = AMMO1TAG;
            }
            else {
              bVar1 = FScanner::Compare(sc,"ammo2tag");
              if (bVar1) {
                this->strValue = AMMO2TAG;
              }
              else {
                bVar1 = FScanner::Compare(sc,"weapontag");
                if (bVar1) {
                  this->strValue = WEAPONTAG;
                }
                else {
                  bVar1 = FScanner::Compare(sc,"inventorytag");
                  if (bVar1) {
                    this->strValue = INVENTORYTAG;
                  }
                  else {
                    bVar1 = FScanner::Compare(sc,"time");
                    if (bVar1) {
                      this->strValue = TIME;
                    }
                    else {
                      bVar1 = FScanner::Compare(sc,"logtext");
                      if (bVar1) {
                        this->strValue = LOGTEXT;
                      }
                      else {
                        bVar1 = FScanner::Compare(sc,"globalvar");
                        if (bVar1) {
                          bVar1 = FScanner::CheckToken(sc,0x28);
                          this->strValue = GLOBALVAR;
                        }
                        else {
                          bVar1 = FScanner::Compare(sc,"globalarray");
                          if (!bVar1) {
                            FScanner::ScriptError(sc,"Unknown string \'%s\'.",sc->String);
                            return;
                          }
                          bVar1 = FScanner::CheckToken(sc,0x28);
                          this->strValue = GLOBALARRAY;
                        }
                        FScanner::MustGetToken(sc,0x104);
                        uVar2 = sc->Number;
                        if (0x3f < uVar2) {
                          FScanner::ScriptError(sc,"Global variable number out of range: %d");
                          uVar2 = sc->Number;
                        }
                        this->valueArgument = uVar2;
                        if (bVar1 != false) {
                          FScanner::MustGetToken(sc,0x29);
                          return;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void	ParseStringValue(FScanner &sc)
		{
			if(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("levelname"))
					strValue = LEVELNAME;
				else if(sc.Compare("levellump"))
					strValue = LEVELLUMP;
				else if(sc.Compare("skillname"))
					strValue = SKILLNAME;
				else if(sc.Compare("playerclass"))
					strValue = PLAYERCLASS;
				else if(sc.Compare("playername"))
					strValue = PLAYERNAME;
				else if(sc.Compare("ammo1tag"))
					strValue = AMMO1TAG;
				else if(sc.Compare("ammo2tag"))
					strValue = AMMO2TAG;
				else if(sc.Compare("weapontag"))
					strValue = WEAPONTAG;
				else if(sc.Compare("inventorytag"))
					strValue = INVENTORYTAG;
				else if(sc.Compare("time"))
					strValue = TIME;
				else if(sc.Compare("logtext"))
					strValue = LOGTEXT;
				else if(sc.Compare("globalvar"))
				{
					bool parenthesized = sc.CheckToken('(');

					strValue = GLOBALVAR;
					sc.MustGetToken(TK_IntConst);
					if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
						sc.ScriptError("Global variable number out of range: %d", sc.Number);
					valueArgument = sc.Number;

					if(parenthesized) sc.MustGetToken(')');
				}
				else if(sc.Compare("globalarray"))
				{
					bool parenthesized = sc.CheckToken('(');

					strValue = GLOBALARRAY;
					sc.MustGetToken(TK_IntConst);
					if(sc.Number < 0 || sc.Number >= NUM_GLOBALVARS)
						sc.ScriptError("Global variable number out of range: %d", sc.Number);
					valueArgument = sc.Number;

					if(parenthesized) sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unknown string '%s'.", sc.String);
			}
			else
			{
				strValue = CONSTANT;
				sc.MustGetToken(TK_StringConst);
				if(sc.String[0] == '$')
					str = GStrings[sc.String+1];
				else
					str = sc.String;
			}
		}